

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
          (t_of<0UL,_65536UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  bool bVar1;
  byte local_51;
  __pointer_type local_48;
  __pointer_type p;
  t_heap<xemmai::t_object> *a_heap_local;
  t_of<0UL,_65536UL> *this_local;
  
  p = (__pointer_type)a_heap;
  a_heap_local = (t_heap<xemmai::t_object> *)this;
  local_48 = std::atomic<xemmai::t_object_*>::load(&this->v_chunks,acquire);
  do {
    local_51 = 0;
    if (local_48 != (__pointer_type)0x0) {
      bVar1 = std::atomic<xemmai::t_object_*>::compare_exchange_weak
                        (&this->v_chunks,&local_48,local_48->v_previous,acquire);
      local_51 = bVar1 ^ 0xff;
    }
  } while ((local_51 & 1) != 0);
  if (local_48 == (__pointer_type)0x0) {
    local_48 = f_grow(this,(t_heap<xemmai::t_object> *)p);
  }
  LOCK();
  (this->v_allocated).super___atomic_base<unsigned_long>._M_i =
       (this->v_allocated).super___atomic_base<unsigned_long>._M_i + local_48->v_cyclic;
  UNLOCK();
  return local_48;
}

Assistant:

T* f_allocate(t_heap& a_heap)
		{
			auto p = v_chunks.load(std::memory_order_acquire);
			while (p && !v_chunks.compare_exchange_weak(p, p->v_previous, std::memory_order_acquire));
			if (!p) p = f_grow(a_heap);
			v_allocated.fetch_add(p->v_cyclic, std::memory_order_relaxed);
			return p;
		}